

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  undefined3 uVar1;
  ImU8 IVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  float *pfVar7;
  ImGuiTableTempData *pIVar8;
  float fVar9;
  float fVar10;
  ImVec4 IVar11;
  int i_2;
  int i_1;
  ImGuiWindow *window;
  int i;
  float memory_compact_start_time;
  ImGuiViewportP *viewport;
  int n_2;
  int n_1;
  ImRect virtual_space;
  int n;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000364;
  bool *in_stack_00000368;
  char *in_stack_00000370;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ImGuiTable *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar12;
  int local_68;
  int local_64;
  int local_58;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  ImRect local_30;
  int local_20;
  ImRect local_1c;
  int local_c;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_c = (GImGui->Hooks).Size;
  while (local_c = local_c + -1, -1 < local_c) {
    pIVar4 = ImVector<ImGuiContextHook>::operator[](&local_8->Hooks,local_c);
    if (*(int *)(pIVar4 + 4) == 7) {
      in_stack_ffffffffffffff80 = (ImGuiTable *)&local_8->Hooks;
      ImVector<ImGuiContextHook>::operator[](&local_8->Hooks,local_c);
      ImVector<ImGuiContextHook>::erase
                ((ImVector<ImGuiContextHook> *)in_stack_ffffffffffffff80,
                 (ImGuiContextHook *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  CallContextHooks((ImGuiContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (ImGuiContextHookType)in_stack_ffffffffffffff8c);
  ErrorCheckNewFrameSanityChecks();
  UpdateSettings();
  local_8->Time = (double)(local_8->IO).DeltaTime + local_8->Time;
  local_8->WithinFrameScope = true;
  local_8->FrameCount = local_8->FrameCount + 1;
  local_8->TooltipOverrideCount = 0;
  local_8->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,in_stack_ffffffffffffff6c);
  local_8->FramerateSecPerFrameAccum =
       ((local_8->IO).DeltaTime - local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx]) +
       local_8->FramerateSecPerFrameAccum;
  local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx] = (local_8->IO).DeltaTime;
  local_8->FramerateSecPerFrameIdx = (local_8->FramerateSecPerFrameIdx + 1) % 0x3c;
  iVar3 = ImMin<int>(local_8->FramerateSecPerFrameCount + 1,0x3c);
  local_8->FramerateSecPerFrameCount = iVar3;
  if (local_8->FramerateSecPerFrameAccum <= 0.0) {
    fVar9 = 3.4028235e+38;
  }
  else {
    fVar9 = 1.0 / (local_8->FramerateSecPerFrameAccum / (float)local_8->FramerateSecPerFrameCount);
  }
  (local_8->IO).Framerate = fVar9;
  UpdateViewportsNewFrame();
  ((local_8->IO).Fonts)->Locked = true;
  GetDefaultFont();
  SetCurrentFont((ImFont *)in_stack_ffffffffffffff80);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff80,fVar9,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  for (local_20 = 0; local_20 < (local_8->Viewports).Size; local_20 = local_20 + 1) {
    ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_20);
    local_30 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)0x49a602);
    ImRect::Add(&local_1c,&local_30);
  }
  IVar11 = ImRect::ToVec4((ImRect *)0x49a634);
  local_40 = IVar11._0_8_;
  (local_8->DrawListSharedData).ClipRectFullscreen.x = (float)(undefined4)local_40;
  (local_8->DrawListSharedData).ClipRectFullscreen.y = (float)local_40._4_4_;
  local_38 = IVar11._8_8_;
  (local_8->DrawListSharedData).ClipRectFullscreen.z = (float)(undefined4)local_38;
  (local_8->DrawListSharedData).ClipRectFullscreen.w = (float)local_38._4_4_;
  (local_8->DrawListSharedData).CurveTessellationTol = (local_8->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError
            ((ImDrawListSharedData *)in_stack_ffffffffffffff80,fVar9);
  (local_8->DrawListSharedData).InitialFlags = 0;
  if (((local_8->Style).AntiAliasedLines & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 1;
  }
  if ((((local_8->Style).AntiAliasedLinesUseTex & 1U) != 0) &&
     ((local_8->Font->ContainerAtlas->Flags & 4U) == 0)) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 2;
  }
  if (((local_8->Style).AntiAliasedFill & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 4;
  }
  if (((local_8->IO).BackendFlags & 8U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 8;
  }
  for (local_44 = 0; local_44 < (local_8->Viewports).Size; local_44 = local_44 + 1) {
    ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_44);
    ImDrawData::Clear((ImDrawData *)0x49a7bf);
  }
  if (((local_8->DragDropActive & 1U) != 0) &&
     ((local_8->DragDropPayload).SourceId == local_8->ActiveId)) {
    KeepAliveID((local_8->DragDropPayload).SourceId);
  }
  if (local_8->HoveredIdPreviousFrame == 0) {
    local_8->HoveredIdTimer = 0.0;
  }
  if ((local_8->HoveredIdPreviousFrame == 0) ||
     ((local_8->HoveredId != 0 && (local_8->ActiveId == local_8->HoveredId)))) {
    local_8->HoveredIdNotActiveTimer = 0.0;
  }
  if (local_8->HoveredId != 0) {
    local_8->HoveredIdTimer = (local_8->IO).DeltaTime + local_8->HoveredIdTimer;
  }
  if ((local_8->HoveredId != 0) && (local_8->ActiveId != local_8->HoveredId)) {
    local_8->HoveredIdNotActiveTimer = (local_8->IO).DeltaTime + local_8->HoveredIdNotActiveTimer;
  }
  local_8->HoveredIdPreviousFrame = local_8->HoveredId;
  local_8->HoveredId = 0;
  local_8->HoveredIdAllowOverlap = false;
  local_8->HoveredIdDisabled = false;
  if (((local_8->ActiveId != 0) && (local_8->ActiveIdIsAlive != local_8->ActiveId)) &&
     (local_8->ActiveIdPreviousFrame == local_8->ActiveId)) {
    if ((local_8->DebugLogFlags & 1U) != 0) {
      DebugLog("NewFrame(): ClearActiveID() because it isn\'t marked alive anymore!\n");
    }
    ClearActiveID();
  }
  if (local_8->ActiveId != 0) {
    local_8->ActiveIdTimer = (local_8->IO).DeltaTime + local_8->ActiveIdTimer;
  }
  local_8->LastActiveIdTimer = (local_8->IO).DeltaTime + local_8->LastActiveIdTimer;
  local_8->ActiveIdPreviousFrame = local_8->ActiveId;
  local_8->ActiveIdPreviousFrameWindow = local_8->ActiveIdWindow;
  local_8->ActiveIdPreviousFrameHasBeenEditedBefore =
       (bool)(local_8->ActiveIdHasBeenEditedBefore & 1);
  local_8->ActiveIdIsAlive = 0;
  local_8->ActiveIdHasBeenEditedThisFrame = false;
  local_8->ActiveIdPreviousFrameIsAlive = false;
  local_8->ActiveIdIsJustActivated = false;
  if ((local_8->TempInputId != 0) && (local_8->ActiveId != local_8->TempInputId)) {
    local_8->TempInputId = 0;
  }
  if (local_8->ActiveId == 0) {
    local_8->ActiveIdUsingNavDirMask = 0;
    local_8->ActiveIdUsingAllKeyboardKeys = false;
    local_8->ActiveIdUsingNavInputMask = 0;
  }
  if (local_8->ActiveId == 0) {
    local_8->ActiveIdUsingNavInputMask = 0;
  }
  else if ((local_8->ActiveIdUsingNavInputMask != 0) &&
          ((local_8->ActiveIdUsingNavInputMask & 2) != 0)) {
    SetKeyOwner((ImGuiKey)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                (ImGuiID)in_stack_ffffffffffffff80,(ImGuiInputFlags)fVar9);
  }
  local_8->HoverDelayIdPreviousFrame = local_8->HoverDelayId;
  if (local_8->HoverDelayId == 0) {
    if (0.0 < local_8->HoverDelayTimer) {
      local_8->HoverDelayClearTimer = (local_8->IO).DeltaTime + local_8->HoverDelayClearTimer;
      fVar9 = local_8->HoverDelayClearTimer;
      fVar10 = ImMax<float>(0.2,(local_8->IO).DeltaTime * 2.0);
      if (fVar10 <= fVar9) {
        local_8->HoverDelayClearTimer = 0.0;
        local_8->HoverDelayTimer = 0.0;
      }
    }
  }
  else {
    local_8->HoverDelayTimer = (local_8->IO).DeltaTime + local_8->HoverDelayTimer;
    local_8->HoverDelayClearTimer = 0.0;
    local_8->HoverDelayId = 0;
  }
  local_8->DragDropAcceptIdPrev = local_8->DragDropAcceptIdCurr;
  local_8->DragDropAcceptIdCurr = 0;
  local_8->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  local_8->DragDropWithinSource = false;
  local_8->DragDropWithinTarget = false;
  local_8->DragDropHoldJustPressedId = 0;
  ImVector<ImGuiInputEvent>::resize
            ((ImVector<ImGuiInputEvent> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  UpdateInputEvents(memory_compact_start_time._3_1_);
  UpdateKeyboardInputs();
  NavUpdate();
  UpdateMouseInputs();
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar5 = GetTopMostPopupModal();
  if ((pIVar5 != (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_8->NavWindowingHighlightAlpha)))) {
    fVar9 = ImMin<float>((local_8->IO).DeltaTime * 6.0 + local_8->DimBgRatio,1.0);
    local_8->DimBgRatio = fVar9;
  }
  else {
    fVar9 = ImMax<float>(-(local_8->IO).DeltaTime * 10.0 + local_8->DimBgRatio,0.0);
    local_8->DimBgRatio = fVar9;
  }
  local_8->MouseCursor = 0;
  local_8->WantTextInputNextFrame = -1;
  local_8->WantCaptureKeyboardNextFrame = -1;
  local_8->WantCaptureMouseNextFrame = -1;
  uVar1 = *(undefined3 *)&(local_8->PlatformImeData).field_0x1;
  fVar9 = (local_8->PlatformImeData).InputPos.x;
  (local_8->PlatformImeDataPrev).WantVisible = (local_8->PlatformImeData).WantVisible;
  *(undefined3 *)&(local_8->PlatformImeDataPrev).field_0x1 = uVar1;
  (local_8->PlatformImeDataPrev).InputPos.x = fVar9;
  *(undefined8 *)&(local_8->PlatformImeDataPrev).InputPos.y =
       *(undefined8 *)&(local_8->PlatformImeData).InputPos.y;
  (local_8->PlatformImeData).WantVisible = false;
  UpdateMouseWheel();
  if (((local_8->GcCompactAll & 1U) != 0) ||
     (pfVar7 = &(local_8->IO).ConfigMemoryCompactTimer, *pfVar7 <= 0.0 && *pfVar7 != 0.0)) {
    fVar9 = 3.4028235e+38;
  }
  else {
    fVar9 = (float)local_8->Time - (local_8->IO).ConfigMemoryCompactTimer;
  }
  fVar10 = fVar9;
  for (local_58 = 0; local_58 != (local_8->Windows).Size; local_58 = local_58 + 1) {
    ppIVar6 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_58);
    pIVar5 = *ppIVar6;
    pIVar5->WasActive = (bool)(pIVar5->Active & 1);
    pIVar5->Active = false;
    pIVar5->WriteAccessed = false;
    pIVar5->BeginCountPreviousFrame = pIVar5->BeginCount;
    pIVar5->BeginCount = 0;
    if ((((pIVar5->WasActive & 1U) == 0) && ((pIVar5->MemoryCompacted & 1U) == 0)) &&
       (pIVar5->LastTimeActive < fVar9)) {
      GcCompactTransientWindowBuffers((ImGuiWindow *)0x49b051);
    }
  }
  for (local_64 = 0; local_64 < (local_8->TablesLastTimeActive).Size; local_64 = local_64 + 1) {
    pfVar7 = ImVector<float>::operator[](&local_8->TablesLastTimeActive,local_64);
    if ((0.0 <= *pfVar7) &&
       (pfVar7 = ImVector<float>::operator[](&local_8->TablesLastTimeActive,local_64),
       *pfVar7 < fVar9)) {
      ImPool<ImGuiTable>::GetByIndex
                ((ImPool<ImGuiTable> *)CONCAT44(fVar10,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
      TableGcCompactTransientBuffers(in_stack_ffffffffffffff80);
    }
  }
  for (local_68 = 0; local_68 < (local_8->TablesTempData).Size; local_68 = local_68 + 1) {
    pIVar8 = ImVector<ImGuiTableTempData>::operator[](&local_8->TablesTempData,local_68);
    if ((0.0 <= pIVar8->LastTimeActive) &&
       (pIVar8 = ImVector<ImGuiTableTempData>::operator[](&local_8->TablesTempData,local_68),
       pIVar8->LastTimeActive < fVar9)) {
      ImVector<ImGuiTableTempData>::operator[](&local_8->TablesTempData,local_68);
      TableGcCompactTransientBuffers((ImGuiTableTempData *)0x49b185);
    }
  }
  if ((local_8->GcCompactAll & 1U) != 0) {
    GcCompactTransientMiscBuffers();
  }
  local_8->GcCompactAll = false;
  if ((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->WasActive & 1U) == 0)) {
    FocusTopMostWindowUnderOne
              ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  ImVector<ImGuiWindowStackData>::resize
            ((ImVector<ImGuiWindowStackData> *)CONCAT44(fVar10,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  ImVector<ImGuiPopupData>::resize
            ((ImVector<ImGuiPopupData> *)CONCAT44(fVar10,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  ImVector<int>::resize
            ((ImVector<int> *)CONCAT44(fVar10,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c);
  uVar12 = 0;
  ImVector<int>::push_back
            ((ImVector<int> *)CONCAT44(fVar10,in_stack_ffffffffffffff70),
             (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  ImVector<ImGuiGroupData>::resize
            ((ImVector<ImGuiGroupData> *)CONCAT44(fVar10,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  UpdateDebugToolItemPicker();
  UpdateDebugToolStackQueries();
  if ((local_8->DebugLocateFrames != '\0') &&
     (IVar2 = local_8->DebugLocateFrames + 0xff, local_8->DebugLocateFrames = IVar2, IVar2 == '\0'))
  {
    local_8->DebugLocateId = 0;
  }
  local_8->WithinFrameScopeWithImplicitWindow = true;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff8c,400.0,400.0);
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffff8c,4);
  Begin(in_stack_00000370,in_stack_00000368,in_stack_00000364);
  CallContextHooks((ImGuiContext *)CONCAT44(uVar12,in_stack_ffffffffffffff90),
                   (ImGuiContextHookType)in_stack_ffffffffffffff8c);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Clear ActiveID if the item is not alive anymore.
    // In 1.87, the common most call to KeepAliveID() was moved from GetID() to ItemAdd().
    // As a result, custom widget using ButtonBehavior() _without_ ItemAdd() need to call KeepAliveID() themselves.
    if (g.ActiveId != 0 && g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("NewFrame(): ClearActiveID() because it isn't marked alive anymore!\n");
        ClearActiveID();
    }

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingAllKeyboardKeys = false;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
        g.ActiveIdUsingNavInputMask = 0x00;
#endif
    }

#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    if (g.ActiveId == 0)
        g.ActiveIdUsingNavInputMask = 0;
    else if (g.ActiveIdUsingNavInputMask != 0)
    {
        // If your custom widget code used:                 { g.ActiveIdUsingNavInputMask |= (1 << ImGuiNavInput_Cancel); }
        // Since IMGUI_VERSION_NUM >= 18804 it should be:   { SetKeyOwner(ImGuiKey_Escape, g.ActiveId); SetKeyOwner(ImGuiKey_NavGamepadCancel, g.ActiveId); }
        if (g.ActiveIdUsingNavInputMask & (1 << ImGuiNavInput_Cancel))
            SetKeyOwner(ImGuiKey_Escape, g.ActiveId);
        if (g.ActiveIdUsingNavInputMask & ~(1 << ImGuiNavInput_Cancel))
            IM_ASSERT(0); // Other values unsupported
    }
#endif

    // Update hover delay for IsItemHovered() with delays and tooltips
    g.HoverDelayIdPreviousFrame = g.HoverDelayId;
    if (g.HoverDelayId != 0)
    {
        //if (g.IO.MouseDelta.x == 0.0f && g.IO.MouseDelta.y == 0.0f) // Need design/flags
        g.HoverDelayTimer += g.IO.DeltaTime;
        g.HoverDelayClearTimer = 0.0f;
        g.HoverDelayId = 0;
    }
    else if (g.HoverDelayTimer > 0.0f)
    {
        // This gives a little bit of leeway before clearing the hover timer, allowing mouse to cross gaps
        g.HoverDelayClearTimer += g.IO.DeltaTime;
        if (g.HoverDelayClearTimer >= ImMax(0.20f, g.IO.DeltaTime * 2.0f)) // ~6 frames at 30 Hz + allow for low framerate
            g.HoverDelayTimer = g.HoverDelayClearTimer = 0.0f; // May want a decaying timer, in which case need to clamp at max first, based on max of caller last requested timer.
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
        window->BeginCountPreviousFrame = window->BeginCount;
        window->BeginCount = 0;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();
    if (g.DebugLocateFrames > 0 && --g.DebugLocateFrames == 0)
        g.DebugLocateId = 0;

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it prevents ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}